

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O3

void sznet::net::detail::removeKcpConnection(EventLoop *loop,KcpConnectionPtr *conn)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  peVar1 = (conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_40._8_8_ = 0;
  local_40._M_unused._M_object = operator_new(0x20);
  local_28 = std::
             _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>_>
             ::_M_invoke;
  *(code **)local_40._M_unused._0_8_ = KcpConnection::connectDestroyed;
  *(undefined8 *)((long)local_40._M_unused._0_8_ + 8) = 0;
  *(element_type **)((long)local_40._M_unused._0_8_ + 0x10) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_40._M_unused._0_8_ + 0x18) = p_Var2
  ;
  local_30 = std::
             _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpConnection::*(std::shared_ptr<sznet::net::KcpConnection>))()>_>
             ::_M_manager;
  EventLoop::queueInLoop(loop,(Functor *)&local_40);
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  return;
}

Assistant:

void removeKcpConnection(EventLoop* loop, const KcpConnectionPtr& conn)
{
	loop->queueInLoop(std::bind(&KcpConnection::connectDestroyed, conn));
}